

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::AddKel(TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
         *this,TPZFMatrix<std::complex<float>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  TPZFrontSym<std::complex<float>_> *this_00;
  int64_t iVar2;
  ostream *GlobalSize;
  TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *this_01;
  TPZBaseMatrix *in_RDI;
  lock_guard<std::mutex> lock;
  TPZEqnArray<std::complex<float>_> *AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  mutex_type *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffff88;
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *in_stack_ffffffffffffff90;
  int64_t *in_stack_ffffffffffffff98;
  int64_t *in_stack_ffffffffffffffa0;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffffb0;
  TPZVec<long> *in_stack_ffffffffffffffb8;
  TPZVec<long> *in_stack_ffffffffffffffc0;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffc8;
  TPZFrontSym<std::complex<float>_> *in_stack_ffffffffffffffd0;
  long local_28;
  
  TPZFrontSym<std::complex<float>_>::AddKel
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::EquationsToDecompose
            ((TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
              *)in_stack_ffffffffffffffb0,(TPZVec<long> *)in_RDI,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  if (local_28 <= (long)in_stack_ffffffffffffffd0) {
    this_00 = (TPZFrontSym<std::complex<float>_> *)operator_new(0x3290);
    TPZEqnArray<std::complex<float>_>::TPZEqnArray(in_stack_ffffffffffffffb0);
    TPZFrontSym<std::complex<float>_>::DecomposeEquations
              (this_00,(int64_t)in_stack_ffffffffffffff98,(int64_t)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
    ::CheckCompress(in_stack_ffffffffffffff90);
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    TPZStack<TPZEqnArray<std::complex<float>_>_*,_10>::Push
              ((TPZStack<TPZEqnArray<std::complex<float>_>_*,_10> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (in_stack_ffffffffffffffd0 == (TPZFrontSym<std::complex<float>_> *)(iVar2 + -1)) {
      GlobalSize = (ostream *)
                   std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      this_01 = (TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                 *)std::operator<<(GlobalSize,"Decomposition finished");
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      FinishWriting(this_01);
      TPZFrontSym<std::complex<float>_>::Reset(in_stack_ffffffffffffffd0,(int64_t)GlobalSize);
    }
    std::condition_variable::notify_all();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d4485b);
  }
  DVar1 = TPZFrontSym<std::complex<float>_>::GetDecomposeType
                    ((TPZFrontSym<std::complex<float>_> *)&in_RDI[6].fDecomposed);
  in_RDI->fDecomposed = (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	this->fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_DEBUG(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);

	if(maxeq >= mineq) {
		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;

		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        std::lock_guard<std::mutex> lock(fwritelock);
		fEqnStack.Push(AuxEqn);
		if(maxeq == this->Rows()-1){
            //check if writeing is over and closes file
			cout << endl << "Decomposition finished" << endl;
			cout.flush();
			FinishWriting();
			this->fFront.Reset(0);
			//fStorage.ReOpen();
		}
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}